

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacPtr.c
# Opt level: O2

void Bac_PtrDumpModuleVerilog(FILE *pFile,Vec_Ptr_t *vNtk)

{
  void *pvVar1;
  Vec_Ptr_t *pVVar2;
  
  pvVar1 = Vec_PtrEntry(vNtk,0);
  fprintf((FILE *)pFile,"module %s (\n    ",pvVar1);
  pVVar2 = (Vec_Ptr_t *)Vec_PtrEntry(vNtk,1);
  Bac_PtrDumpSignalsVerilog(pFile,pVVar2,1);
  pVVar2 = (Vec_Ptr_t *)Vec_PtrEntry(vNtk,2);
  Bac_PtrDumpSignalsVerilog(pFile,pVVar2,0);
  fwrite("\n  );\n",6,1,(FILE *)pFile);
  fwrite("  input",7,1,(FILE *)pFile);
  pVVar2 = (Vec_Ptr_t *)Vec_PtrEntry(vNtk,1);
  Bac_PtrDumpSignalsVerilog(pFile,pVVar2,0);
  fwrite(";\n",2,1,(FILE *)pFile);
  fwrite("  output",8,1,(FILE *)pFile);
  pVVar2 = (Vec_Ptr_t *)Vec_PtrEntry(vNtk,2);
  Bac_PtrDumpSignalsVerilog(pFile,pVVar2,0);
  fwrite(";\n",2,1,(FILE *)pFile);
  pvVar1 = Vec_PtrEntry(vNtk,3);
  if (*(int *)((long)pvVar1 + 4) == 0) {
    pVVar2 = (Vec_Ptr_t *)Vec_PtrEntry(vNtk,4);
    Bac_PtrDumpBoxesVerilog(pFile,pVVar2);
    fwrite("endmodule\n\n",0xb,1,(FILE *)pFile);
    return;
  }
  __assert_fail("Vec_PtrSize((Vec_Ptr_t *)Vec_PtrEntry(vNtk, 3)) == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bacPtr.c"
                ,0xfc,"void Bac_PtrDumpModuleVerilog(FILE *, Vec_Ptr_t *)");
}

Assistant:

void Bac_PtrDumpModuleVerilog( FILE * pFile, Vec_Ptr_t * vNtk )
{
    fprintf( pFile, "module %s (\n    ", (char *)Vec_PtrEntry(vNtk, 0) );
    Bac_PtrDumpSignalsVerilog( pFile, (Vec_Ptr_t *)Vec_PtrEntry(vNtk, 1), 1 );
    Bac_PtrDumpSignalsVerilog( pFile, (Vec_Ptr_t *)Vec_PtrEntry(vNtk, 2), 0 );
    fprintf( pFile, "\n  );\n" );
    fprintf( pFile, "  input" );
    Bac_PtrDumpSignalsVerilog( pFile, (Vec_Ptr_t *)Vec_PtrEntry(vNtk, 1), 0 );
    fprintf( pFile, ";\n" );
    fprintf( pFile, "  output" );
    Bac_PtrDumpSignalsVerilog( pFile, (Vec_Ptr_t *)Vec_PtrEntry(vNtk, 2), 0 );
    fprintf( pFile, ";\n" );
    assert( Vec_PtrSize((Vec_Ptr_t *)Vec_PtrEntry(vNtk, 3)) == 0 ); // no nodes; only boxes
    Bac_PtrDumpBoxesVerilog( pFile, (Vec_Ptr_t *)Vec_PtrEntry(vNtk, 4) );
    fprintf( pFile, "endmodule\n\n" );
}